

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519_asn1.cc
# Opt level: O1

int x25519_set_priv_raw(EVP_PKEY *pkey,uint8_t *in,size_t len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint8_t *out_public_value;
  int iVar4;
  
  if (len == 0x20) {
    out_public_value = (uint8_t *)OPENSSL_malloc(0x41);
    if (out_public_value == (uint8_t *)0x0) {
      iVar4 = 0;
    }
    else {
      uVar1 = *(undefined8 *)in;
      uVar2 = *(undefined8 *)(in + 8);
      uVar3 = *(undefined8 *)(in + 0x18);
      *(undefined8 *)(out_public_value + 0x30) = *(undefined8 *)(in + 0x10);
      *(undefined8 *)(out_public_value + 0x38) = uVar3;
      *(undefined8 *)(out_public_value + 0x20) = uVar1;
      *(undefined8 *)(out_public_value + 0x28) = uVar2;
      X25519_public_from_private(out_public_value,out_public_value + 0x20);
      out_public_value[0x40] = '\x01';
      OPENSSL_free(pkey->pkey);
      pkey->pkey = out_public_value;
      iVar4 = 1;
    }
  }
  else {
    iVar4 = 0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                  ,0x21);
  }
  return iVar4;
}

Assistant:

static int x25519_set_priv_raw(EVP_PKEY *pkey, const uint8_t *in, size_t len) {
  if (len != 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  X25519_KEY *key =
      reinterpret_cast<X25519_KEY *>(OPENSSL_malloc(sizeof(X25519_KEY)));
  if (key == NULL) {
    return 0;
  }

  OPENSSL_memcpy(key->priv, in, 32);
  X25519_public_from_private(key->pub, key->priv);
  key->has_private = 1;

  x25519_free(pkey);
  pkey->pkey = key;
  return 1;
}